

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

int main(void)

{
  undefined1 local_8050 [8];
  Poller po;
  TcpListener tl;
  
  Poller::Poller((Poller *)local_8050);
  Poller::Init((Poller *)local_8050,0x400,10);
  TcpListener::TcpListener((TcpListener *)(po.buffPool.objs_._M_elems + 0xfff));
  TcpListener::Listen((TcpListener *)(po.buffPool.objs_._M_elems + 0xfff),0x22b0);
  Poller::Add((Poller *)local_8050,(PollObj *)(po.buffPool.objs_._M_elems + 0xfff),0x11);
  do {
    Poller::Process((Poller *)local_8050);
  } while( true );
}

Assistant:

int main() {
    Poller po;
    po.Init(1024, 10);
    TcpListener tl;
    tl.Listen(8880);
    po.Add(&tl, EV_READ|EV_ET);
    while (true)
    {
        po.Process();
    }
    


    return 0;
}